

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O0

REF_STATUS ref_fixture_tri2_grid(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  uint uVar2;
  int local_56c;
  int local_540;
  int local_514;
  int local_4e8;
  long local_4b0;
  REF_INT local_4a0;
  long local_498;
  long local_478;
  long local_448;
  REF_INT local_438;
  long local_430;
  long local_410;
  long local_3e0;
  REF_INT local_3d0;
  long local_3c8;
  long local_3a8;
  int local_388;
  int local_35c;
  int local_330;
  long local_2f8;
  REF_INT local_2e8;
  long local_2e0;
  long local_2c0;
  long local_290;
  REF_INT local_280;
  long local_278;
  long local_258;
  long local_228;
  REF_INT local_218;
  long local_210;
  long local_1f0;
  int local_1cc;
  int local_1a0;
  int local_174;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nnodesg;
  REF_INT cell;
  REF_INT local [27];
  REF_INT global [27];
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  uVar2 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x1a1
           ,"ref_fixture_tri2_grid",(ulong)uVar2,"create");
    return uVar2;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node_00 = pRVar1->node;
  pRVar1->twod = 1;
  local[0x1a] = 0;
  if (0 / ((ref_mpi->n + 3) / ref_mpi->n) < 4 - ref_mpi->n * (3 / ref_mpi->n)) {
    local_174 = 0 / ((ref_mpi->n + 3) / ref_mpi->n);
  }
  else {
    local_174 = -((4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                (3 / ref_mpi->n) + (4 - ref_mpi->n * (3 / ref_mpi->n));
  }
  if (ref_mpi->id == local_174) {
LAB_00150009:
    uVar2 = ref_node_add(ref_node_00,0,&nnodesg);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x1b1,"ref_fixture_tri2_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[nnodesg * 0xf] = 0.0;
    ref_node_00->real[nnodesg * 0xf + 1] = 0.0;
    ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_1f0 = -1;
    }
    else {
      local_1f0 = ref_node_00->global[nnodesg];
    }
    if (local_1f0 / (long)((ref_mpi->n + 3) / ref_mpi->n) <
        (long)(4 - ref_mpi->n * (3 / ref_mpi->n))) {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_210 = -1;
      }
      else {
        local_210 = ref_node_00->global[nnodesg];
      }
      local_218 = (REF_INT)(local_210 / (long)((ref_mpi->n + 3) / ref_mpi->n));
    }
    else {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_228 = -1;
      }
      else {
        local_228 = ref_node_00->global[nnodesg];
      }
      local_218 = (int)((local_228 -
                        (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                       (long)(3 / ref_mpi->n)) + (4 - ref_mpi->n * (3 / ref_mpi->n));
    }
    ref_node_00->part[nnodesg] = local_218;
    uVar2 = ref_node_add(ref_node_00,1,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x1b2,"ref_fixture_tri2_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[cell * 0xf] = 0.0;
    ref_node_00->real[cell * 0xf + 1] = 1.0;
    ref_node_00->real[cell * 0xf + 2] = 0.0;
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_258 = -1;
    }
    else {
      local_258 = ref_node_00->global[cell];
    }
    if (local_258 / (long)((ref_mpi->n + 3) / ref_mpi->n) <
        (long)(4 - ref_mpi->n * (3 / ref_mpi->n))) {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_278 = -1;
      }
      else {
        local_278 = ref_node_00->global[cell];
      }
      local_280 = (REF_INT)(local_278 / (long)((ref_mpi->n + 3) / ref_mpi->n));
    }
    else {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_290 = -1;
      }
      else {
        local_290 = ref_node_00->global[cell];
      }
      local_280 = (int)((local_290 -
                        (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                       (long)(3 / ref_mpi->n)) + (4 - ref_mpi->n * (3 / ref_mpi->n));
    }
    ref_node_00->part[cell] = local_280;
    uVar2 = ref_node_add(ref_node_00,2,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x1b3,"ref_fixture_tri2_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[0] * 0xf] = 1.0;
    ref_node_00->real[local[0] * 0xf + 1] = 0.0;
    ref_node_00->real[local[0] * 0xf + 2] = 0.0;
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_2c0 = -1;
    }
    else {
      local_2c0 = ref_node_00->global[local[0]];
    }
    if (local_2c0 / (long)((ref_mpi->n + 3) / ref_mpi->n) <
        (long)(4 - ref_mpi->n * (3 / ref_mpi->n))) {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_2e0 = -1;
      }
      else {
        local_2e0 = ref_node_00->global[local[0]];
      }
      local_2e8 = (REF_INT)(local_2e0 / (long)((ref_mpi->n + 3) / ref_mpi->n));
    }
    else {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_2f8 = -1;
      }
      else {
        local_2f8 = ref_node_00->global[local[0]];
      }
      local_2e8 = (int)((local_2f8 -
                        (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                       (long)(3 / ref_mpi->n)) + (4 - ref_mpi->n * (3 / ref_mpi->n));
    }
    ref_node_00->part[local[0]] = local_2e8;
    uVar2 = ref_cell_add(pRVar1->cell[3],&nnodesg,&ref_private_macro_code_rss);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x1b5,"ref_fixture_tri2_grid",(ulong)uVar2,"add tri");
      return uVar2;
    }
  }
  else {
    if (1 / ((ref_mpi->n + 3) / ref_mpi->n) < 4 - ref_mpi->n * (3 / ref_mpi->n)) {
      local_1a0 = 1 / ((ref_mpi->n + 3) / ref_mpi->n);
    }
    else {
      local_1a0 = (1 - (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                  (3 / ref_mpi->n) + (4 - ref_mpi->n * (3 / ref_mpi->n));
    }
    if (ref_mpi->id == local_1a0) goto LAB_00150009;
    if (2 / ((ref_mpi->n + 3) / ref_mpi->n) < 4 - ref_mpi->n * (3 / ref_mpi->n)) {
      local_1cc = 2 / ((ref_mpi->n + 3) / ref_mpi->n);
    }
    else {
      local_1cc = (2 - (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                  (3 / ref_mpi->n) + (4 - ref_mpi->n * (3 / ref_mpi->n));
    }
    if (ref_mpi->id == local_1cc) goto LAB_00150009;
  }
  local[0x1a] = 0;
  if (0 / ((ref_mpi->n + 3) / ref_mpi->n) < 4 - ref_mpi->n * (3 / ref_mpi->n)) {
    local_330 = 0 / ((ref_mpi->n + 3) / ref_mpi->n);
  }
  else {
    local_330 = -((4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                (3 / ref_mpi->n) + (4 - ref_mpi->n * (3 / ref_mpi->n));
  }
  if (ref_mpi->id == local_330) {
LAB_00150fb0:
    uVar2 = ref_node_add(ref_node_00,0,&nnodesg);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x1c2,"ref_fixture_tri2_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[nnodesg * 0xf] = 0.0;
    ref_node_00->real[nnodesg * 0xf + 1] = 0.0;
    ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_3a8 = -1;
    }
    else {
      local_3a8 = ref_node_00->global[nnodesg];
    }
    if (local_3a8 / (long)((ref_mpi->n + 3) / ref_mpi->n) <
        (long)(4 - ref_mpi->n * (3 / ref_mpi->n))) {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_3c8 = -1;
      }
      else {
        local_3c8 = ref_node_00->global[nnodesg];
      }
      local_3d0 = (REF_INT)(local_3c8 / (long)((ref_mpi->n + 3) / ref_mpi->n));
    }
    else {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_3e0 = -1;
      }
      else {
        local_3e0 = ref_node_00->global[nnodesg];
      }
      local_3d0 = (int)((local_3e0 -
                        (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                       (long)(3 / ref_mpi->n)) + (4 - ref_mpi->n * (3 / ref_mpi->n));
    }
    ref_node_00->part[nnodesg] = local_3d0;
    uVar2 = ref_node_add(ref_node_00,3,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x1c3,"ref_fixture_tri2_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[cell * 0xf] = -1.0;
    ref_node_00->real[cell * 0xf + 1] = 0.0;
    ref_node_00->real[cell * 0xf + 2] = 0.0;
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_410 = -1;
    }
    else {
      local_410 = ref_node_00->global[cell];
    }
    if (local_410 / (long)((ref_mpi->n + 3) / ref_mpi->n) <
        (long)(4 - ref_mpi->n * (3 / ref_mpi->n))) {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_430 = -1;
      }
      else {
        local_430 = ref_node_00->global[cell];
      }
      local_438 = (REF_INT)(local_430 / (long)((ref_mpi->n + 3) / ref_mpi->n));
    }
    else {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_448 = -1;
      }
      else {
        local_448 = ref_node_00->global[cell];
      }
      local_438 = (int)((local_448 -
                        (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                       (long)(3 / ref_mpi->n)) + (4 - ref_mpi->n * (3 / ref_mpi->n));
    }
    ref_node_00->part[cell] = local_438;
    uVar2 = ref_node_add(ref_node_00,1,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x1c4,"ref_fixture_tri2_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[0] * 0xf] = 0.0;
    ref_node_00->real[local[0] * 0xf + 1] = 1.0;
    ref_node_00->real[local[0] * 0xf + 2] = 0.0;
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_478 = -1;
    }
    else {
      local_478 = ref_node_00->global[local[0]];
    }
    if (local_478 / (long)((ref_mpi->n + 3) / ref_mpi->n) <
        (long)(4 - ref_mpi->n * (3 / ref_mpi->n))) {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_498 = -1;
      }
      else {
        local_498 = ref_node_00->global[local[0]];
      }
      local_4a0 = (REF_INT)(local_498 / (long)((ref_mpi->n + 3) / ref_mpi->n));
    }
    else {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_4b0 = -1;
      }
      else {
        local_4b0 = ref_node_00->global[local[0]];
      }
      local_4a0 = (int)((local_4b0 -
                        (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                       (long)(3 / ref_mpi->n)) + (4 - ref_mpi->n * (3 / ref_mpi->n));
    }
    ref_node_00->part[local[0]] = local_4a0;
    uVar2 = ref_cell_add(pRVar1->cell[3],&nnodesg,&ref_private_macro_code_rss);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x1c6,"ref_fixture_tri2_grid",(ulong)uVar2,"add tri");
      return uVar2;
    }
  }
  else {
    if (3 / ((ref_mpi->n + 3) / ref_mpi->n) < 4 - ref_mpi->n * (3 / ref_mpi->n)) {
      local_35c = 3 / ((ref_mpi->n + 3) / ref_mpi->n);
    }
    else {
      local_35c = (3 - (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                  (3 / ref_mpi->n) + (4 - ref_mpi->n * (3 / ref_mpi->n));
    }
    if (ref_mpi->id == local_35c) goto LAB_00150fb0;
    if (1 / ((ref_mpi->n + 3) / ref_mpi->n) < 4 - ref_mpi->n * (3 / ref_mpi->n)) {
      local_388 = 1 / ((ref_mpi->n + 3) / ref_mpi->n);
    }
    else {
      local_388 = (1 - (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                  (3 / ref_mpi->n) + (4 - ref_mpi->n * (3 / ref_mpi->n));
    }
    if (ref_mpi->id == local_388) goto LAB_00150fb0;
  }
  uVar2 = ref_node_initialize_n_global(ref_node_00,4);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x1c9
           ,"ref_fixture_tri2_grid",(ulong)uVar2,"init glob");
    return uVar2;
  }
  local[0x1a] = 0;
  if (0 / ((ref_mpi->n + 3) / ref_mpi->n) < 4 - ref_mpi->n * (3 / ref_mpi->n)) {
    local_4e8 = 0 / ((ref_mpi->n + 3) / ref_mpi->n);
  }
  else {
    local_4e8 = -((4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                (3 / ref_mpi->n) + (4 - ref_mpi->n * (3 / ref_mpi->n));
  }
  if (ref_mpi->id != local_4e8) {
    if (2 / ((ref_mpi->n + 3) / ref_mpi->n) < 4 - ref_mpi->n * (3 / ref_mpi->n)) {
      local_514 = 2 / ((ref_mpi->n + 3) / ref_mpi->n);
    }
    else {
      local_514 = (2 - (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                  (3 / ref_mpi->n) + (4 - ref_mpi->n * (3 / ref_mpi->n));
    }
    if (ref_mpi->id != local_514) goto LAB_00151f65;
  }
  uVar2 = ref_node_local(ref_node_00,0,&nnodesg);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x1d2
           ,"ref_fixture_tri2_grid",(ulong)uVar2,"loc");
    return uVar2;
  }
  uVar2 = ref_node_local(ref_node_00,2,&cell);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x1d3
           ,"ref_fixture_tri2_grid",(ulong)uVar2,"loc");
    return uVar2;
  }
  local[0] = 10;
  uVar2 = ref_cell_add(pRVar1->cell[0],&nnodesg,&ref_private_macro_code_rss);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x1d5
           ,"ref_fixture_tri2_grid",(ulong)uVar2,"add edg");
    return uVar2;
  }
LAB_00151f65:
  local[0x1a] = 3;
  if (3 / ((ref_mpi->n + 3) / ref_mpi->n) < 4 - ref_mpi->n * (3 / ref_mpi->n)) {
    local_540 = 3 / ((ref_mpi->n + 3) / ref_mpi->n);
  }
  else {
    local_540 = (3 - (4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                (3 / ref_mpi->n) + (4 - ref_mpi->n * (3 / ref_mpi->n));
  }
  if (ref_mpi->id != local_540) {
    if (0 / ((ref_mpi->n + 3) / ref_mpi->n) < 4 - ref_mpi->n * (3 / ref_mpi->n)) {
      local_56c = 0 / ((ref_mpi->n + 3) / ref_mpi->n);
    }
    else {
      local_56c = -((4 - ref_mpi->n * (3 / ref_mpi->n)) * ((ref_mpi->n + 3) / ref_mpi->n)) /
                  (3 / ref_mpi->n) + (4 - ref_mpi->n * (3 / ref_mpi->n));
    }
    if (ref_mpi->id != local_56c) {
      return 0;
    }
  }
  uVar2 = ref_node_local(ref_node_00,3,&nnodesg);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x1df
           ,"ref_fixture_tri2_grid",(ulong)uVar2,"loc");
    return uVar2;
  }
  uVar2 = ref_node_local(ref_node_00,0,&cell);
  if (uVar2 == 0) {
    local[0] = 10;
    uVar2 = ref_cell_add(pRVar1->cell[0],&nnodesg,&ref_private_macro_code_rss);
    if (uVar2 == 0) {
      return 0;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x1e2
           ,"ref_fixture_tri2_grid",(ulong)uVar2,"add edg");
    return uVar2;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x1e0,
         "ref_fixture_tri2_grid",(ulong)uVar2,"loc");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tri2_grid(REF_GRID *ref_grid_ptr,
                                         REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 4;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 0.0, 1.0, 0.0);
    add_that_node(2, 1.0, 0.0, 0.0);

    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  global[0] = 0;
  global[1] = 3;
  global[2] = 1;
  global[3] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, -1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  global[0] = 0;
  global[1] = 2;
  global[2] = 10;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    local[2] = global[2];
    RSS(ref_cell_add(ref_grid_edg(ref_grid), local, &cell), "add edg");
  }

  global[0] = 3;
  global[1] = 0;
  global[2] = 10;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    local[2] = global[2];
    RSS(ref_cell_add(ref_grid_edg(ref_grid), local, &cell), "add edg");
  }

  return REF_SUCCESS;
}